

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar22;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar35;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar33;
  float fVar34;
  undefined1 in_register_00001204 [60];
  undefined1 auVar32 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  float fVar45;
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar47;
  undefined1 auVar44 [32];
  float fVar49;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  float fVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  float in_register_0000159c;
  undefined1 auVar71 [32];
  
  auVar32._4_60_ = in_register_00001204;
  auVar32._0_4_ = scale;
  fVar34 = scale * r_scale0;
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  pcVar4 = pBVar3[itime].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[itime].super_RawBufferView.stride;
  uVar2 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  lVar20 = sVar5 * uVar2;
  fVar22 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar33 = fVar34 * fVar22 * *(float *)(pcVar4 + lVar20 + 0xc);
  auVar70 = vshufps_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),0);
  fVar67 = auVar70._0_4_;
  fVar68 = auVar70._4_4_;
  fVar69 = auVar70._8_4_;
  auVar40 = vshufps_avx(auVar32._0_16_,auVar32._0_16_,0);
  auVar11 = vsubps_avx(*(undefined1 (*) [16])(pcVar4 + lVar20),(undefined1  [16])ofs->field_0);
  fVar35 = auVar40._0_4_;
  auVar50._0_4_ = fVar35 * auVar11._0_4_;
  fVar45 = auVar40._4_4_;
  auVar50._4_4_ = fVar45 * auVar11._4_4_;
  fVar46 = auVar40._8_4_;
  auVar50._8_4_ = fVar46 * auVar11._8_4_;
  fVar49 = auVar40._12_4_;
  auVar50._12_4_ = fVar49 * auVar11._12_4_;
  auVar40 = vshufps_avx(auVar50,auVar50,0);
  fVar53 = (space->vx).field_0.m128[0];
  fVar47 = (space->vx).field_0.m128[1];
  fVar56 = (space->vx).field_0.m128[2];
  fVar62 = (space->vx).field_0.m128[3];
  fVar63 = (space->vy).field_0.m128[0];
  fVar55 = (space->vy).field_0.m128[1];
  fVar60 = (space->vy).field_0.m128[2];
  fVar61 = (space->vy).field_0.m128[3];
  fVar16 = (space->vz).field_0.m128[0];
  fVar17 = (space->vz).field_0.m128[1];
  fVar18 = (space->vz).field_0.m128[2];
  fVar19 = (space->vz).field_0.m128[3];
  auVar11 = vshufps_avx(auVar50,auVar50,0x55);
  auVar24 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar51._0_4_ = auVar40._0_4_ * fVar53 + auVar11._0_4_ * fVar63 + fVar16 * auVar24._0_4_;
  auVar51._4_4_ = auVar40._4_4_ * fVar47 + auVar11._4_4_ * fVar55 + fVar17 * auVar24._4_4_;
  auVar51._8_4_ = auVar40._8_4_ * fVar56 + auVar11._8_4_ * fVar60 + fVar18 * auVar24._8_4_;
  auVar51._12_4_ = auVar40._12_4_ * fVar62 + auVar11._12_4_ * fVar61 + fVar19 * auVar24._12_4_;
  auVar40 = vinsertps_avx(auVar51,ZEXT416((uint)fVar33),0x30);
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar6 = pBVar3[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar3[itime].super_RawBufferView.stride;
  lVar20 = uVar2 * sVar7;
  pfVar1 = (float *)(pcVar6 + lVar20);
  auVar57._0_4_ = fVar35 * *pfVar1;
  auVar57._4_4_ = fVar45 * pfVar1[1];
  auVar57._8_4_ = fVar46 * pfVar1[2];
  auVar57._12_4_ = fVar49 * pfVar1[3];
  auVar11 = vshufps_avx(auVar57,auVar57,0);
  auVar24 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar36 = vshufps_avx(auVar57,auVar57,0x55);
  auVar58._0_4_ = auVar11._0_4_ * fVar53 + auVar24._0_4_ * fVar16 + auVar36._0_4_ * fVar63;
  auVar58._4_4_ = auVar11._4_4_ * fVar47 + auVar24._4_4_ * fVar17 + auVar36._4_4_ * fVar55;
  auVar58._8_4_ = auVar11._8_4_ * fVar56 + auVar24._8_4_ * fVar18 + auVar36._8_4_ * fVar60;
  auVar58._12_4_ = auVar11._12_4_ * fVar62 + auVar24._12_4_ * fVar19 + auVar36._12_4_ * fVar61;
  auVar11 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar22 * *(float *)(pcVar6 + lVar20 + 0xc) * fVar34
                                                )),0x30);
  auVar52._0_4_ = auVar40._0_4_ + auVar11._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar40._4_4_ + auVar11._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar40._8_4_ + auVar11._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar40._12_4_ + auVar11._12_4_ * 0.33333334;
  auVar40 = vshufps_avx(auVar52,auVar52,0xff);
  lVar21 = sVar5 * (uVar2 + 1);
  auVar11 = vsubps_avx(*(undefined1 (*) [16])(pcVar4 + lVar21),(undefined1  [16])ofs->field_0);
  auVar42._0_4_ = fVar35 * auVar11._0_4_;
  auVar42._4_4_ = fVar45 * auVar11._4_4_;
  auVar42._8_4_ = fVar46 * auVar11._8_4_;
  auVar42._12_4_ = fVar49 * auVar11._12_4_;
  auVar11 = vshufps_avx(auVar42,auVar42,0x55);
  auVar24 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar36 = vshufps_avx(auVar42,auVar42,0);
  auVar54._0_4_ = fVar53 * auVar36._0_4_ + fVar16 * auVar24._0_4_ + fVar63 * auVar11._0_4_;
  auVar54._4_4_ = fVar47 * auVar36._4_4_ + fVar17 * auVar24._4_4_ + fVar55 * auVar11._4_4_;
  auVar54._8_4_ = fVar56 * auVar36._8_4_ + fVar18 * auVar24._8_4_ + fVar60 * auVar11._8_4_;
  auVar54._12_4_ = fVar62 * auVar36._12_4_ + fVar19 * auVar24._12_4_ + fVar61 * auVar11._12_4_;
  lVar20 = sVar7 * (uVar2 + 1);
  pfVar1 = (float *)(pcVar6 + lVar20);
  auVar43._0_4_ = fVar35 * *pfVar1;
  auVar43._4_4_ = fVar45 * pfVar1[1];
  auVar43._8_4_ = fVar46 * pfVar1[2];
  auVar43._12_4_ = fVar49 * pfVar1[3];
  auVar11 = vshufps_avx(auVar43,auVar43,0);
  auVar24 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar36 = vshufps_avx(auVar43,auVar43,0x55);
  fVar33 = auVar40._0_4_;
  fVar35 = auVar40._4_4_;
  fVar46 = auVar40._8_4_;
  fVar49 = auVar40._12_4_;
  fVar45 = fVar22 * *(float *)(pcVar4 + lVar21 + 0xc) * fVar34;
  auVar40 = vinsertps_avx(auVar54,ZEXT416((uint)fVar45),0x30);
  auVar23._0_4_ = fVar53 * auVar11._0_4_ + fVar16 * auVar24._0_4_ + auVar36._0_4_ * fVar63;
  auVar23._4_4_ = fVar47 * auVar11._4_4_ + fVar17 * auVar24._4_4_ + auVar36._4_4_ * fVar55;
  auVar23._8_4_ = fVar56 * auVar11._8_4_ + fVar18 * auVar24._8_4_ + auVar36._8_4_ * fVar60;
  auVar23._12_4_ = fVar62 * auVar11._12_4_ + fVar19 * auVar24._12_4_ + auVar36._12_4_ * fVar61;
  auVar11 = vinsertps_avx(auVar23,ZEXT416((uint)(fVar34 * fVar22 * *(float *)(pcVar6 + lVar20 + 0xc)
                                                )),0x30);
  auVar24._0_4_ = auVar11._0_4_ * 0.33333334;
  auVar24._4_4_ = auVar11._4_4_ * 0.33333334;
  auVar24._8_4_ = auVar11._8_4_ * 0.33333334;
  auVar24._12_4_ = auVar11._12_4_ * 0.33333334;
  auVar24 = vsubps_avx(auVar40,auVar24);
  auVar40 = vshufps_avx(auVar24,auVar24,0xff);
  fVar22 = auVar40._0_4_;
  fVar53 = auVar40._4_4_;
  fVar47 = auVar40._8_4_;
  fVar62 = auVar40._12_4_;
  auVar40 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
  fVar34 = auVar40._0_4_;
  fVar45 = auVar40._4_4_;
  fVar56 = auVar40._8_4_;
  fVar63 = auVar40._12_4_;
  auVar44._0_4_ =
       fVar67 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._1632_4_ * fVar33 +
       (float)bezier_basis0._2788_4_ * fVar22 + (float)bezier_basis0._3944_4_ * fVar34;
  auVar44._4_4_ =
       fVar68 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._1636_4_ * fVar35 +
       (float)bezier_basis0._2792_4_ * fVar53 + (float)bezier_basis0._3948_4_ * fVar45;
  auVar44._8_4_ =
       fVar69 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._1640_4_ * fVar46 +
       (float)bezier_basis0._2796_4_ * fVar47 + (float)bezier_basis0._3952_4_ * fVar56;
  auVar44._12_4_ =
       auVar70._12_4_ * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._1644_4_ * fVar49 +
       (float)bezier_basis0._2800_4_ * fVar62 + (float)bezier_basis0._3956_4_ * fVar63;
  auVar44._16_4_ =
       fVar67 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._1648_4_ * fVar33 +
       (float)bezier_basis0._2804_4_ * fVar22 + (float)bezier_basis0._3960_4_ * fVar34;
  auVar44._20_4_ =
       fVar68 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._1652_4_ * fVar35 +
       (float)bezier_basis0._2808_4_ * fVar53 + (float)bezier_basis0._3964_4_ * fVar45;
  auVar44._24_4_ =
       fVar69 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._1656_4_ * fVar46 +
       (float)bezier_basis0._2812_4_ * fVar47 + (float)bezier_basis0._3968_4_ * fVar56;
  auVar44._28_4_ = in_register_0000159c + 0.0;
  auVar25._0_4_ =
       fVar67 * (float)bezier_basis0._5100_4_ +
       fVar33 * (float)bezier_basis0._6256_4_ +
       fVar22 * (float)bezier_basis0._7412_4_ + fVar34 * (float)bezier_basis0._8568_4_;
  auVar25._4_4_ =
       fVar68 * (float)bezier_basis0._5104_4_ +
       fVar35 * (float)bezier_basis0._6260_4_ +
       fVar53 * (float)bezier_basis0._7416_4_ + fVar45 * (float)bezier_basis0._8572_4_;
  auVar25._8_4_ =
       fVar69 * (float)bezier_basis0._5108_4_ +
       fVar46 * (float)bezier_basis0._6264_4_ +
       fVar47 * (float)bezier_basis0._7420_4_ + fVar56 * (float)bezier_basis0._8576_4_;
  auVar25._12_4_ =
       auVar70._12_4_ * (float)bezier_basis0._5112_4_ +
       fVar49 * (float)bezier_basis0._6268_4_ +
       fVar62 * (float)bezier_basis0._7424_4_ + fVar63 * (float)bezier_basis0._8580_4_;
  auVar25._16_4_ =
       fVar67 * (float)bezier_basis0._5116_4_ +
       fVar33 * (float)bezier_basis0._6272_4_ +
       fVar22 * (float)bezier_basis0._7428_4_ + fVar34 * (float)bezier_basis0._8584_4_;
  auVar25._20_4_ =
       fVar68 * (float)bezier_basis0._5120_4_ +
       fVar35 * (float)bezier_basis0._6276_4_ +
       fVar53 * (float)bezier_basis0._7432_4_ + fVar45 * (float)bezier_basis0._8588_4_;
  auVar25._24_4_ =
       fVar69 * (float)bezier_basis0._5124_4_ +
       fVar46 * (float)bezier_basis0._6280_4_ +
       fVar47 * (float)bezier_basis0._7436_4_ + fVar56 * (float)bezier_basis0._8592_4_;
  auVar25._28_4_ = (float)bezier_basis0._5128_4_ + (float)bezier_basis0._6284_4_ + fVar62 + fVar63;
  auVar70 = ZEXT416(0);
  auVar26 = vblendps_avx(auVar25,ZEXT1632(auVar70),1);
  auVar8._4_4_ = auVar26._4_4_ * 0.055555556;
  auVar8._0_4_ = auVar26._0_4_ * 0.055555556;
  auVar8._8_4_ = auVar26._8_4_ * 0.055555556;
  auVar8._12_4_ = auVar26._12_4_ * 0.055555556;
  auVar8._16_4_ = auVar26._16_4_ * 0.055555556;
  auVar8._20_4_ = auVar26._20_4_ * 0.055555556;
  auVar8._24_4_ = auVar26._24_4_ * 0.055555556;
  auVar8._28_4_ = auVar26._28_4_;
  auVar13 = vsubps_avx(auVar44,auVar8);
  auVar26 = vblendps_avx(auVar25,ZEXT1632(auVar70),0x80);
  auVar37._0_4_ = auVar44._0_4_ + auVar26._0_4_ * 0.055555556;
  auVar37._4_4_ = auVar44._4_4_ + auVar26._4_4_ * 0.055555556;
  auVar37._8_4_ = auVar44._8_4_ + auVar26._8_4_ * 0.055555556;
  auVar37._12_4_ = auVar44._12_4_ + auVar26._12_4_ * 0.055555556;
  auVar37._16_4_ = auVar44._16_4_ + auVar26._16_4_ * 0.055555556;
  auVar37._20_4_ = auVar44._20_4_ + auVar26._20_4_ * 0.055555556;
  auVar37._24_4_ = auVar44._24_4_ + auVar26._24_4_ * 0.055555556;
  auVar37._28_4_ = auVar44._28_4_ + auVar26._28_4_;
  auVar26._8_4_ = 0xff800000;
  auVar26._0_8_ = 0xff800000ff800000;
  auVar26._12_4_ = 0xff800000;
  auVar26._16_4_ = 0xff800000;
  auVar26._20_4_ = 0xff800000;
  auVar26._24_4_ = 0xff800000;
  auVar26._28_4_ = 0xff800000;
  auVar26 = vmaxps_avx(auVar26,auVar44);
  auVar8 = vmaxps_avx(auVar13,auVar37);
  auVar25 = vmaxps_avx(auVar26,auVar8);
  auVar40 = vshufps_avx(auVar24,auVar24,0xaa);
  auVar11 = vshufps_avx(auVar54,auVar54,0xaa);
  fVar22 = auVar40._0_4_;
  fVar35 = auVar40._4_4_;
  fVar46 = auVar40._8_4_;
  fVar62 = auVar40._12_4_;
  fVar33 = auVar11._0_4_;
  fVar53 = auVar11._4_4_;
  fVar47 = auVar11._8_4_;
  fVar63 = auVar11._12_4_;
  auVar40 = vshufps_avx(auVar52,auVar52,0xaa);
  fVar34 = auVar40._0_4_;
  fVar45 = auVar40._4_4_;
  fVar56 = auVar40._8_4_;
  auVar11 = vshufps_avx(auVar51,auVar51,0xaa);
  fVar55 = auVar11._0_4_;
  fVar60 = auVar11._4_4_;
  fVar61 = auVar11._8_4_;
  auVar64._0_4_ =
       fVar55 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._1632_4_ * fVar34 +
       (float)bezier_basis0._2788_4_ * fVar22 + (float)bezier_basis0._3944_4_ * fVar33;
  auVar64._4_4_ =
       fVar60 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._1636_4_ * fVar45 +
       (float)bezier_basis0._2792_4_ * fVar35 + (float)bezier_basis0._3948_4_ * fVar53;
  auVar64._8_4_ =
       fVar61 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._1640_4_ * fVar56 +
       (float)bezier_basis0._2796_4_ * fVar46 + (float)bezier_basis0._3952_4_ * fVar47;
  auVar64._12_4_ =
       auVar11._12_4_ * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._1644_4_ * auVar40._12_4_ +
       (float)bezier_basis0._2800_4_ * fVar62 + (float)bezier_basis0._3956_4_ * fVar63;
  auVar64._16_4_ =
       fVar55 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._1648_4_ * fVar34 +
       (float)bezier_basis0._2804_4_ * fVar22 + (float)bezier_basis0._3960_4_ * fVar33;
  auVar64._20_4_ =
       fVar60 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._1652_4_ * fVar45 +
       (float)bezier_basis0._2808_4_ * fVar35 + (float)bezier_basis0._3964_4_ * fVar53;
  auVar64._24_4_ =
       fVar61 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._1656_4_ * fVar56 +
       (float)bezier_basis0._2812_4_ * fVar46 + (float)bezier_basis0._3968_4_ * fVar47;
  auVar64._28_4_ = (float)bezier_basis0._3972_4_ + fVar49 + auVar44._28_4_ + auVar13._28_4_;
  auVar27._0_4_ =
       fVar55 * (float)bezier_basis0._5100_4_ +
       (float)bezier_basis0._6256_4_ * fVar34 +
       (float)bezier_basis0._7412_4_ * fVar22 + (float)bezier_basis0._8568_4_ * fVar33;
  auVar27._4_4_ =
       fVar60 * (float)bezier_basis0._5104_4_ +
       (float)bezier_basis0._6260_4_ * fVar45 +
       (float)bezier_basis0._7416_4_ * fVar35 + (float)bezier_basis0._8572_4_ * fVar53;
  auVar27._8_4_ =
       fVar61 * (float)bezier_basis0._5108_4_ +
       (float)bezier_basis0._6264_4_ * fVar56 +
       (float)bezier_basis0._7420_4_ * fVar46 + (float)bezier_basis0._8576_4_ * fVar47;
  auVar27._12_4_ =
       auVar11._12_4_ * (float)bezier_basis0._5112_4_ +
       (float)bezier_basis0._6268_4_ * auVar40._12_4_ +
       (float)bezier_basis0._7424_4_ * fVar62 + (float)bezier_basis0._8580_4_ * fVar63;
  auVar27._16_4_ =
       fVar55 * (float)bezier_basis0._5116_4_ +
       (float)bezier_basis0._6272_4_ * fVar34 +
       (float)bezier_basis0._7428_4_ * fVar22 + (float)bezier_basis0._8584_4_ * fVar33;
  auVar27._20_4_ =
       fVar60 * (float)bezier_basis0._5120_4_ +
       (float)bezier_basis0._6276_4_ * fVar45 +
       (float)bezier_basis0._7432_4_ * fVar35 + (float)bezier_basis0._8588_4_ * fVar53;
  auVar27._24_4_ =
       fVar61 * (float)bezier_basis0._5124_4_ +
       (float)bezier_basis0._6280_4_ * fVar56 +
       (float)bezier_basis0._7436_4_ * fVar46 + (float)bezier_basis0._8592_4_ * fVar47;
  auVar27._28_4_ = fVar63 + fVar63 + fVar62 + fVar63;
  auVar26 = vblendps_avx(auVar27,ZEXT1632(auVar70),1);
  auVar9._4_4_ = auVar26._4_4_ * 0.055555556;
  auVar9._0_4_ = auVar26._0_4_ * 0.055555556;
  auVar9._8_4_ = auVar26._8_4_ * 0.055555556;
  auVar9._12_4_ = auVar26._12_4_ * 0.055555556;
  auVar9._16_4_ = auVar26._16_4_ * 0.055555556;
  auVar9._20_4_ = auVar26._20_4_ * 0.055555556;
  auVar9._24_4_ = auVar26._24_4_ * 0.055555556;
  auVar9._28_4_ = auVar26._28_4_;
  auVar14 = vsubps_avx(auVar64,auVar9);
  auVar26 = vblendps_avx(auVar27,ZEXT1632(auVar70),0x80);
  auVar59._0_4_ = auVar64._0_4_ + auVar26._0_4_ * 0.055555556;
  auVar59._4_4_ = auVar64._4_4_ + auVar26._4_4_ * 0.055555556;
  auVar59._8_4_ = auVar64._8_4_ + auVar26._8_4_ * 0.055555556;
  auVar59._12_4_ = auVar64._12_4_ + auVar26._12_4_ * 0.055555556;
  auVar59._16_4_ = auVar64._16_4_ + auVar26._16_4_ * 0.055555556;
  auVar59._20_4_ = auVar64._20_4_ + auVar26._20_4_ * 0.055555556;
  auVar59._24_4_ = auVar64._24_4_ + auVar26._24_4_ * 0.055555556;
  auVar59._28_4_ = auVar64._28_4_ + auVar26._28_4_;
  auVar28._8_4_ = 0xff800000;
  auVar28._0_8_ = 0xff800000ff800000;
  auVar28._12_4_ = 0xff800000;
  auVar28._16_4_ = 0xff800000;
  auVar28._20_4_ = 0xff800000;
  auVar28._24_4_ = 0xff800000;
  auVar28._28_4_ = 0xff800000;
  auVar26 = vmaxps_avx(auVar28,auVar64);
  auVar8 = vmaxps_avx(auVar14,auVar59);
  auVar9 = vmaxps_avx(auVar26,auVar8);
  auVar40 = vshufps_avx(auVar24,auVar24,0x55);
  auVar11 = vshufps_avx(auVar54,auVar54,0x55);
  fVar22 = auVar40._0_4_;
  fVar33 = auVar40._4_4_;
  fVar34 = auVar40._8_4_;
  fVar35 = auVar40._12_4_;
  fVar53 = auVar11._0_4_;
  fVar45 = auVar11._4_4_;
  fVar46 = auVar11._8_4_;
  fVar47 = auVar11._12_4_;
  auVar40 = vshufps_avx(auVar52,auVar52,0x55);
  fVar56 = auVar40._0_4_;
  fVar49 = auVar40._4_4_;
  fVar62 = auVar40._8_4_;
  auVar11 = vshufps_avx(auVar51,auVar51,0x55);
  fVar63 = auVar11._0_4_;
  fVar55 = auVar11._4_4_;
  fVar60 = auVar11._8_4_;
  auVar71._0_4_ =
       fVar63 * (float)bezier_basis0._476_4_ +
       fVar56 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar22 + fVar53 * (float)bezier_basis0._3944_4_;
  auVar71._4_4_ =
       fVar55 * (float)bezier_basis0._480_4_ +
       fVar49 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar33 + fVar45 * (float)bezier_basis0._3948_4_;
  auVar71._8_4_ =
       fVar60 * (float)bezier_basis0._484_4_ +
       fVar62 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar34 + fVar46 * (float)bezier_basis0._3952_4_;
  auVar71._12_4_ =
       auVar11._12_4_ * (float)bezier_basis0._488_4_ +
       auVar40._12_4_ * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar35 + fVar47 * (float)bezier_basis0._3956_4_;
  auVar71._16_4_ =
       fVar63 * (float)bezier_basis0._492_4_ +
       fVar56 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar22 + fVar53 * (float)bezier_basis0._3960_4_;
  auVar71._20_4_ =
       fVar55 * (float)bezier_basis0._496_4_ +
       fVar49 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar33 + fVar45 * (float)bezier_basis0._3964_4_;
  auVar71._24_4_ =
       fVar60 * (float)bezier_basis0._500_4_ +
       fVar62 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar34 + fVar46 * (float)bezier_basis0._3968_4_;
  auVar71._28_4_ = auVar64._28_4_ + auVar59._28_4_ + 0.0 + 0.0;
  auVar38._0_4_ =
       fVar63 * (float)bezier_basis0._5100_4_ +
       (float)bezier_basis0._6256_4_ * fVar56 +
       (float)bezier_basis0._7412_4_ * fVar22 + (float)bezier_basis0._8568_4_ * fVar53;
  auVar38._4_4_ =
       fVar55 * (float)bezier_basis0._5104_4_ +
       (float)bezier_basis0._6260_4_ * fVar49 +
       (float)bezier_basis0._7416_4_ * fVar33 + (float)bezier_basis0._8572_4_ * fVar45;
  auVar38._8_4_ =
       fVar60 * (float)bezier_basis0._5108_4_ +
       (float)bezier_basis0._6264_4_ * fVar62 +
       (float)bezier_basis0._7420_4_ * fVar34 + (float)bezier_basis0._8576_4_ * fVar46;
  auVar38._12_4_ =
       auVar11._12_4_ * (float)bezier_basis0._5112_4_ +
       (float)bezier_basis0._6268_4_ * auVar40._12_4_ +
       (float)bezier_basis0._7424_4_ * fVar35 + (float)bezier_basis0._8580_4_ * fVar47;
  auVar38._16_4_ =
       fVar63 * (float)bezier_basis0._5116_4_ +
       (float)bezier_basis0._6272_4_ * fVar56 +
       (float)bezier_basis0._7428_4_ * fVar22 + (float)bezier_basis0._8584_4_ * fVar53;
  auVar38._20_4_ =
       fVar55 * (float)bezier_basis0._5120_4_ +
       (float)bezier_basis0._6276_4_ * fVar49 +
       (float)bezier_basis0._7432_4_ * fVar33 + (float)bezier_basis0._8588_4_ * fVar45;
  auVar38._24_4_ =
       fVar60 * (float)bezier_basis0._5124_4_ +
       (float)bezier_basis0._6280_4_ * fVar62 +
       (float)bezier_basis0._7436_4_ * fVar34 + (float)bezier_basis0._8592_4_ * fVar46;
  auVar38._28_4_ = fVar47 + fVar47 + fVar35 + fVar47;
  auVar26 = vblendps_avx(auVar38,ZEXT432(0) << 0x20,1);
  auVar10._4_4_ = auVar26._4_4_ * 0.055555556;
  auVar10._0_4_ = auVar26._0_4_ * 0.055555556;
  auVar10._8_4_ = auVar26._8_4_ * 0.055555556;
  auVar10._12_4_ = auVar26._12_4_ * 0.055555556;
  auVar10._16_4_ = auVar26._16_4_ * 0.055555556;
  auVar10._20_4_ = auVar26._20_4_ * 0.055555556;
  auVar10._24_4_ = auVar26._24_4_ * 0.055555556;
  auVar10._28_4_ = auVar26._28_4_;
  auVar27 = vsubps_avx(auVar71,auVar10);
  auVar26 = vblendps_avx(auVar38,ZEXT432(0) << 0x20,0x80);
  auVar39._0_4_ = auVar71._0_4_ + auVar26._0_4_ * 0.055555556;
  auVar39._4_4_ = auVar71._4_4_ + auVar26._4_4_ * 0.055555556;
  auVar39._8_4_ = auVar71._8_4_ + auVar26._8_4_ * 0.055555556;
  auVar39._12_4_ = auVar71._12_4_ + auVar26._12_4_ * 0.055555556;
  auVar39._16_4_ = auVar71._16_4_ + auVar26._16_4_ * 0.055555556;
  auVar39._20_4_ = auVar71._20_4_ + auVar26._20_4_ * 0.055555556;
  auVar39._24_4_ = auVar71._24_4_ + auVar26._24_4_ * 0.055555556;
  auVar39._28_4_ = auVar71._28_4_ + auVar26._28_4_;
  auVar29._8_4_ = 0xff800000;
  auVar29._0_8_ = 0xff800000ff800000;
  auVar29._12_4_ = 0xff800000;
  auVar29._16_4_ = 0xff800000;
  auVar29._20_4_ = 0xff800000;
  auVar29._24_4_ = 0xff800000;
  auVar29._28_4_ = 0xff800000;
  auVar26 = vmaxps_avx(auVar29,auVar71);
  auVar8 = vmaxps_avx(auVar27,auVar39);
  auVar10 = vmaxps_avx(auVar26,auVar8);
  auVar40 = vpermilps_avx(auVar24,0);
  fVar45 = auVar40._0_4_;
  fVar46 = auVar40._4_4_;
  fVar47 = auVar40._8_4_;
  fVar56 = auVar40._12_4_;
  auVar11 = vpermilps_avx(auVar54,0);
  fVar49 = auVar11._0_4_;
  fVar62 = auVar11._4_4_;
  fVar63 = auVar11._8_4_;
  auVar40 = vshufps_avx(auVar52,auVar52,0);
  fVar55 = auVar40._0_4_;
  fVar60 = auVar40._4_4_;
  fVar61 = auVar40._8_4_;
  fVar53 = (float)bezier_basis0._3972_4_ + 0.0 + 0.0;
  auVar70 = vpermilps_avx(auVar51,0);
  fVar22 = auVar70._0_4_;
  fVar33 = auVar70._4_4_;
  fVar34 = auVar70._8_4_;
  fVar35 = auVar70._12_4_;
  auVar66._0_4_ =
       fVar22 * (float)bezier_basis0._476_4_ +
       fVar55 * (float)bezier_basis0._1632_4_ +
       fVar45 * (float)bezier_basis0._2788_4_ + fVar49 * (float)bezier_basis0._3944_4_;
  auVar66._4_4_ =
       fVar33 * (float)bezier_basis0._480_4_ +
       fVar60 * (float)bezier_basis0._1636_4_ +
       fVar46 * (float)bezier_basis0._2792_4_ + fVar62 * (float)bezier_basis0._3948_4_;
  auVar66._8_4_ =
       fVar34 * (float)bezier_basis0._484_4_ +
       fVar61 * (float)bezier_basis0._1640_4_ +
       fVar47 * (float)bezier_basis0._2796_4_ + fVar63 * (float)bezier_basis0._3952_4_;
  auVar66._12_4_ =
       fVar35 * (float)bezier_basis0._488_4_ +
       auVar40._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar56 * (float)bezier_basis0._2800_4_ + auVar11._12_4_ * (float)bezier_basis0._3956_4_;
  auVar66._16_4_ =
       fVar22 * (float)bezier_basis0._492_4_ +
       fVar55 * (float)bezier_basis0._1648_4_ +
       fVar45 * (float)bezier_basis0._2804_4_ + fVar49 * (float)bezier_basis0._3960_4_;
  auVar66._20_4_ =
       fVar33 * (float)bezier_basis0._496_4_ +
       fVar60 * (float)bezier_basis0._1652_4_ +
       fVar46 * (float)bezier_basis0._2808_4_ + fVar62 * (float)bezier_basis0._3964_4_;
  auVar66._24_4_ =
       fVar34 * (float)bezier_basis0._500_4_ +
       fVar61 * (float)bezier_basis0._1656_4_ +
       fVar47 * (float)bezier_basis0._2812_4_ + fVar63 * (float)bezier_basis0._3968_4_;
  auVar66._28_4_ = fVar53 + 0.0;
  auVar30._0_4_ =
       fVar22 * (float)bezier_basis0._5100_4_ +
       fVar55 * (float)bezier_basis0._6256_4_ +
       fVar49 * (float)bezier_basis0._8568_4_ + fVar45 * (float)bezier_basis0._7412_4_;
  auVar30._4_4_ =
       fVar33 * (float)bezier_basis0._5104_4_ +
       fVar60 * (float)bezier_basis0._6260_4_ +
       fVar62 * (float)bezier_basis0._8572_4_ + fVar46 * (float)bezier_basis0._7416_4_;
  auVar30._8_4_ =
       fVar34 * (float)bezier_basis0._5108_4_ +
       fVar61 * (float)bezier_basis0._6264_4_ +
       fVar63 * (float)bezier_basis0._8576_4_ + fVar47 * (float)bezier_basis0._7420_4_;
  auVar30._12_4_ =
       fVar35 * (float)bezier_basis0._5112_4_ +
       auVar40._12_4_ * (float)bezier_basis0._6268_4_ +
       auVar11._12_4_ * (float)bezier_basis0._8580_4_ + fVar56 * (float)bezier_basis0._7424_4_;
  auVar30._16_4_ =
       fVar22 * (float)bezier_basis0._5116_4_ +
       fVar55 * (float)bezier_basis0._6272_4_ +
       fVar49 * (float)bezier_basis0._8584_4_ + fVar45 * (float)bezier_basis0._7428_4_;
  auVar30._20_4_ =
       fVar33 * (float)bezier_basis0._5120_4_ +
       fVar60 * (float)bezier_basis0._6276_4_ +
       fVar62 * (float)bezier_basis0._8588_4_ + fVar46 * (float)bezier_basis0._7432_4_;
  auVar30._24_4_ =
       fVar34 * (float)bezier_basis0._5124_4_ +
       fVar61 * (float)bezier_basis0._6280_4_ +
       fVar63 * (float)bezier_basis0._8592_4_ + fVar47 * (float)bezier_basis0._7436_4_;
  auVar30._28_4_ = fVar35 + (float)bezier_basis0._504_4_ + fVar56 + fVar53;
  auVar26 = vblendps_avx(auVar30,ZEXT832(0) << 0x20,1);
  auVar8 = vblendps_avx(auVar30,ZEXT832(0) << 0x20,0x80);
  auVar15._4_4_ = auVar26._4_4_ * 0.055555556;
  auVar15._0_4_ = auVar26._0_4_ * 0.055555556;
  auVar15._8_4_ = auVar26._8_4_ * 0.055555556;
  auVar15._12_4_ = auVar26._12_4_ * 0.055555556;
  auVar15._16_4_ = auVar26._16_4_ * 0.055555556;
  auVar15._20_4_ = auVar26._20_4_ * 0.055555556;
  auVar15._24_4_ = auVar26._24_4_ * 0.055555556;
  auVar15._28_4_ = auVar26._28_4_;
  auVar41._8_4_ = 0xff800000;
  auVar41._0_8_ = 0xff800000ff800000;
  auVar41._12_4_ = 0xff800000;
  auVar41._16_4_ = 0xff800000;
  auVar41._20_4_ = 0xff800000;
  auVar41._24_4_ = 0xff800000;
  auVar41._28_4_ = 0xff800000;
  auVar26 = vmaxps_avx(auVar41,auVar66);
  auVar15 = vsubps_avx(auVar66,auVar15);
  auVar31._0_4_ = auVar66._0_4_ + auVar8._0_4_ * 0.055555556;
  auVar31._4_4_ = auVar66._4_4_ + auVar8._4_4_ * 0.055555556;
  auVar31._8_4_ = auVar66._8_4_ + auVar8._8_4_ * 0.055555556;
  auVar31._12_4_ = auVar66._12_4_ + auVar8._12_4_ * 0.055555556;
  auVar31._16_4_ = auVar66._16_4_ + auVar8._16_4_ * 0.055555556;
  auVar31._20_4_ = auVar66._20_4_ + auVar8._20_4_ * 0.055555556;
  auVar31._24_4_ = auVar66._24_4_ + auVar8._24_4_ * 0.055555556;
  auVar31._28_4_ = auVar66._28_4_ + auVar8._28_4_;
  auVar8 = vmaxps_avx(auVar15,auVar31);
  auVar26 = vmaxps_avx(auVar26,auVar8);
  auVar8 = vminps_avx(auVar13,auVar37);
  auVar65._8_4_ = 0x7f800000;
  auVar65._0_8_ = 0x7f8000007f800000;
  auVar65._12_4_ = 0x7f800000;
  auVar65._16_4_ = 0x7f800000;
  auVar65._20_4_ = 0x7f800000;
  auVar65._24_4_ = 0x7f800000;
  auVar65._28_4_ = 0x7f800000;
  auVar13 = vminps_avx(auVar65,auVar44);
  auVar8 = vminps_avx(auVar13,auVar8);
  auVar13 = vminps_avx(auVar14,auVar59);
  auVar14 = vminps_avx(auVar65,auVar64);
  auVar13 = vminps_avx(auVar14,auVar13);
  auVar14 = vminps_avx(auVar27,auVar39);
  auVar27 = vminps_avx(auVar65,auVar71);
  auVar14 = vminps_avx(auVar27,auVar14);
  auVar27 = vminps_avx(auVar65,auVar66);
  auVar15 = vminps_avx(auVar15,auVar31);
  auVar27 = vminps_avx(auVar27,auVar15);
  auVar15 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar27,auVar15);
  auVar15 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar15);
  auVar40 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx(auVar14,auVar14,0xb1);
  auVar14 = vminps_avx(auVar14,auVar27);
  auVar27 = vshufpd_avx(auVar14,auVar14,5);
  auVar14 = vminps_avx(auVar14,auVar27);
  auVar11 = vminps_avx(auVar14._0_16_,auVar14._16_16_);
  auVar11 = vunpcklps_avx(auVar40,auVar11);
  auVar14 = vshufps_avx(auVar13,auVar13,0xb1);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar14 = vshufpd_avx(auVar13,auVar13,5);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar40 = vminps_avx(auVar13._0_16_,auVar13._16_16_);
  auVar70 = vinsertps_avx(auVar11,auVar40,0x28);
  auVar13 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vmaxps_avx(auVar26,auVar13);
  auVar13 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vmaxps_avx(auVar26,auVar13);
  auVar40 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar26 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar26 = vmaxps_avx(auVar10,auVar26);
  auVar10 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vmaxps_avx(auVar26,auVar10);
  auVar11 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar11 = vunpcklps_avx(auVar40,auVar11);
  auVar26 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar26 = vmaxps_avx(auVar9,auVar26);
  auVar9 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vmaxps_avx(auVar26,auVar9);
  auVar40 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar24 = vinsertps_avx(auVar11,auVar40,0x28);
  auVar26 = vshufps_avx(auVar8,auVar8,0xb1);
  auVar26 = vminps_avx(auVar8,auVar26);
  auVar8 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vminps_avx(auVar26,auVar8);
  auVar40 = vminss_avx(auVar26._0_16_,auVar26._16_16_);
  auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
  auVar26 = vmaxps_avx(auVar25,auVar26);
  auVar8 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vmaxps_avx(auVar26,auVar8);
  auVar11 = vmaxss_avx(auVar26._0_16_,auVar26._16_16_);
  auVar48._8_4_ = 0x7fffffff;
  auVar48._0_8_ = 0x7fffffff7fffffff;
  auVar48._12_4_ = 0x7fffffff;
  auVar40 = vandps_avx(auVar40,auVar48);
  auVar11 = vandps_avx(auVar11,auVar48);
  auVar40 = vmaxss_avx(auVar11,auVar40);
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar70 = vsubps_avx(auVar70,auVar40);
  auVar36._0_4_ = auVar24._0_4_ + auVar40._0_4_;
  auVar36._4_4_ = auVar24._4_4_ + auVar40._4_4_;
  auVar36._8_4_ = auVar24._8_4_ + auVar40._8_4_;
  auVar36._12_4_ = auVar24._12_4_ + auVar40._12_4_;
  auVar40 = vandps_avx(auVar70,auVar48);
  auVar11 = vandps_avx(auVar36,auVar48);
  auVar40 = vmaxps_avx(auVar40,auVar11);
  auVar11 = vmovshdup_avx(auVar40);
  auVar11 = vmaxss_avx(auVar11,auVar40);
  auVar40 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vmaxss_avx(auVar40,auVar11);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ * 4.7683716e-07));
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar70,auVar40);
  (__return_storage_ptr__->lower).field_0 = aVar12;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar36._0_4_ + auVar40._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar36._4_4_ + auVar40._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar36._8_4_ + auVar40._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar36._12_4_ + auVar40._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }